

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O0

int RDL_timeout_stop_fun(void *p_timeout)

{
  time_t tVar1;
  time_t end;
  void *p_timeout_local;
  
  if (p_timeout != (void *)0x0) {
    RDL_timeout_stop_fun::timeout = *p_timeout;
    RDL_timeout_stop_fun::start = time((time_t *)0x0);
  }
  if ((RDL_timeout_stop_fun::timeout < 0) || (RDL_timeout_stop_fun::start < 0)) {
    p_timeout_local._4_4_ = 0;
  }
  else {
    tVar1 = time((time_t *)0x0);
    if ((long)RDL_timeout_stop_fun::timeout < tVar1 - RDL_timeout_stop_fun::start) {
      p_timeout_local._4_4_ = 1;
    }
    else {
      p_timeout_local._4_4_ = 0;
    }
  }
  return p_timeout_local._4_4_;
}

Assistant:

int RDL_timeout_stop_fun(const void* p_timeout)
{
  static int timeout = -1;
  static time_t start = -1;
  time_t end;

  if (p_timeout) {
    timeout = *(int*)p_timeout;
    start = time(NULL);
  }

  if (timeout < 0 || start < 0) {
    return 0;
  }
  else {
    end = time(NULL);
    if (end - start > timeout) {
      return 1;
    }
    else {
      return 0;
    }
  }
}